

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

void xmlValidateCheckRefCallback(void *payload,void *data,xmlChar *name)

{
  xmlListPtr ref_list;
  xmlValidateMemo memo;
  void *local_10;
  xmlChar *local_8;
  
  if (payload != (void *)0x0) {
    local_10 = data;
    local_8 = name;
    xmlListWalk((xmlListPtr)payload,xmlWalkValidateList,&local_10);
  }
  return;
}

Assistant:

static void
xmlValidateCheckRefCallback(void *payload, void *data, const xmlChar *name) {
    xmlListPtr ref_list = (xmlListPtr) payload;
    xmlValidCtxtPtr ctxt = (xmlValidCtxtPtr) data;
    xmlValidateMemo memo;

    if (ref_list == NULL)
	return;
    memo.ctxt = ctxt;
    memo.name = name;

    xmlListWalk(ref_list, xmlWalkValidateList, &memo);

}